

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O1

bool __thiscall jrtplib::RTPUDPv4Transmitter::NewDataAvailable(RTPUDPv4Transmitter *this)

{
  if ((this->init == true) && (this->created == true)) {
    return (this->rawpacketlist).
           super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>.
           _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&this->rawpacketlist;
  }
  return false;
}

Assistant:

bool RTPUDPv4Transmitter::NewDataAvailable()
{
	if (!init)
		return false;
	
	MAINMUTEX_LOCK
	
	bool v;
		
	if (!created)
		v = false;
	else
	{
		if (rawpacketlist.empty())
			v = false;
		else
			v = true;
	}
	
	MAINMUTEX_UNLOCK
	return v;
}